

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O1

int Abc_IsopCountLits(Vec_Int_t *vCover,int nVars)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = vCover->nSize;
  if (uVar1 == 0) {
    return 0;
  }
  if (uVar1 == 1) {
    if (*vCover->pArray != 0) {
LAB_00413623:
      uVar4 = 1;
      if (1 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar5 = 0;
      iVar2 = 0;
      do {
        if (0 < nVars) {
          bVar3 = 0;
          iVar6 = nVars;
          do {
            switch(vCover->pArray[uVar5] >> (bVar3 & 0x1f) & 3) {
            case 0:
              goto switchD_0041365a_caseD_0;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilIsop.c"
                            ,0x26e,"int Abc_IsopCountLits(Vec_Int_t *, int)");
            }
            iVar2 = iVar2 + 1;
switchD_0041365a_caseD_0:
            bVar3 = bVar3 + 2;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar4);
      return iVar2;
    }
  }
  else if (0 < (int)uVar1) goto LAB_00413623;
  return 0;
}

Assistant:

int Abc_IsopCountLits( Vec_Int_t * vCover, int nVars )
{
    int i, k, Entry, Literal, nLits = 0;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
        return 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++;
            else if ( Literal == 2 ) // pos literal
                nLits++;
            else if ( Literal != 0 ) 
                assert( 0 );
        }
    }
    return nLits;
}